

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O1

void __thiscall
sqlite_orm::internal::table_t<$fff27d53$>::table_t
          (table_t<_fff27d53_> *this,string *name_,columns_type *columns_)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  paVar1 = &(this->super_table_base).name.field_2;
  (this->super_table_base).name._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name_->_M_dataplus)._M_p;
  paVar2 = &name_->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&name_->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->super_table_base).name.field_2 + 8) = uVar4;
  }
  else {
    (this->super_table_base).name._M_dataplus._M_p = pcVar3;
    (this->super_table_base).name.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->super_table_base).name._M_string_length = name_->_M_string_length;
  (name_->_M_dataplus)._M_p = (pointer)paVar2;
  name_->_M_string_length = 0;
  (name_->field_2)._M_local_buf[0] = '\0';
  (this->super_table_base)._without_rowid = false;
  std::_Tuple_impl<$279c0b03$>::_Tuple_impl
            (&(this->columns).super__Tuple_impl<_279c0b03_>,&columns_->super__Tuple_impl<_279c0b03_>
            );
  return;
}

Assistant:

table_t(decltype(name) name_, columns_type columns_) :
        table_base{std::move(name_)}, columns(std::move(columns_)) {}